

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

uint stb_rand(void)

{
  uint uVar1;
  long lVar2;
  
  if ((ulong)(uint)stb__mt_index < 0x9c0) {
    uVar1 = *(uint *)((long)stb__mt_buffer + (ulong)(uint)stb__mt_index);
    stb__mt_index = stb__mt_index + 4;
  }
  else {
    if (stb__mt_index != 0x9c0) {
      stb_srand(0);
    }
    for (lVar2 = 0; lVar2 != 0xe3; lVar2 = lVar2 + 1) {
      uVar1 = 0x9908b0df;
      if ((stb__mt_buffer[lVar2 + 1] & 1) == 0) {
        uVar1 = 0;
      }
      stb__mt_buffer[lVar2] =
           uVar1 ^ stb__mt_buffer[lVar2 + 0x18d] ^
           (stb__mt_buffer[lVar2 + 1] & 0x7ffffffe | stb__mt_buffer[lVar2] & 0x80000000) >> 1;
    }
    for (lVar2 = 0; lVar2 != 0x18c; lVar2 = lVar2 + 1) {
      uVar1 = 0x9908b0df;
      if ((stb__mt_buffer[lVar2 + 0xe4] & 1) == 0) {
        uVar1 = 0;
      }
      stb__mt_buffer[lVar2 + 0xe3] =
           uVar1 ^ stb__mt_buffer[lVar2] ^
           (stb__mt_buffer[lVar2 + 0xe4] & 0x7ffffffe | stb__mt_buffer[lVar2 + 0xe3] & 0x80000000)
           >> 1;
    }
    uVar1 = 0x9908b0df;
    if ((stb__mt_buffer[0] & 1) == 0) {
      uVar1 = 0;
    }
    stb__mt_buffer[0x26f] =
         uVar1 ^ stb__mt_buffer[0x18c] ^
         (stb__mt_buffer[0] & 0x7ffffffe | stb__mt_buffer[0x26f] & 0x80000000) >> 1;
    stb__mt_index = 4;
    uVar1 = stb__mt_buffer[0];
  }
  uVar1 = uVar1 >> 0xb ^ uVar1;
  uVar1 = (uVar1 & 0x13a58ad) << 7 ^ uVar1;
  uVar1 = (uVar1 & 0x1df8c) << 0xf ^ uVar1;
  return uVar1 >> 0x12 ^ uVar1;
}

Assistant:

unsigned int stb_rand()
{
   unsigned int  * b = stb__mt_buffer;
   int idx = stb__mt_index;
   unsigned int  s,r;
   int i;
	
   if (idx >= STB__MT_LEN*sizeof(unsigned int)) {
      if (idx > STB__MT_LEN*sizeof(unsigned int))
         stb_srand(0);
      idx = 0;
      i = 0;
      for (; i < STB__MT_IB; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i + STB__MT_IA] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      for (; i < STB__MT_LEN-1; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i - STB__MT_IB] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      
      s = STB__TWIST(b, STB__MT_LEN-1, 0);
      b[STB__MT_LEN-1] = b[STB__MT_IA-1] ^ (s >> 1) ^ STB__MAGIC(s);
   }
   stb__mt_index = idx + sizeof(unsigned int);
   
   r = *(unsigned int *)((unsigned char *)b + idx);
   
   r ^= (r >> 11);
   r ^= (r << 7) & 0x9D2C5680;
   r ^= (r << 15) & 0xEFC60000;
   r ^= (r >> 18);
   
   return r;
}